

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansi.cc
# Opt level: O0

int ixxx::ansi::fputs(char *__s,FILE *__stream)

{
  int iVar1;
  fputs_error *this;
  int *piVar2;
  int r;
  FILE *stream_local;
  char *s_local;
  
  iVar1 = ::fputs(__s,__stream);
  if (iVar1 == -1) {
    this = (fputs_error *)__cxa_allocate_exception(0x20);
    piVar2 = __errno_location();
    fputs_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
    __cxa_throw(this,&fputs_error::typeinfo,fputs_error::~fputs_error);
  }
  return iVar1;
}

Assistant:

int fputs(const char *s, FILE *stream)
    {
      int r = ::fputs(s, stream);
      if (r == EOF)
        throw fputs_error(errno);
      return r;
    }